

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  TIntermediate *pTVar1;
  TInfoSink *pTVar2;
  TFunction *pTVar3;
  TSpirvType *pTVar4;
  TIntermTyped *pTVar5;
  TIntermNode *function_00;
  bool bVar6;
  int iVar7;
  TOperator op;
  uint uVar8;
  int iVar9;
  TLayoutFormat TVar10;
  TLayoutFormat TVar11;
  char *pcVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TSampler *this_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined8 uVar13;
  undefined4 extraout_var_10;
  TQualifier *this_01;
  undefined4 extraout_var_11;
  long *plVar14;
  ulong uVar15;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TType *pTVar16;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar17;
  reference ppTVar18;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  long lVar19;
  undefined4 extraout_var_33;
  TIntermAggregate *pTVar20;
  undefined4 extraout_var_34;
  byte local_2a1;
  TIntermTyped *local_298;
  TIntermTyped *local_290;
  TIntermUnary *unaryNode;
  TStorageQualifier qual;
  int i_1;
  TQualifierList *qualifierList;
  TString local_208;
  TIntermAggregate *local_1e0;
  TIntermAggregate *call;
  TString *local_1d0;
  TString *local_1c8;
  _func_int **local_1c0;
  TString *local_1b8;
  TString *local_1b0;
  char *local_1a8;
  char *message;
  TQualifier *pTStack_198;
  bool containsBindlessSampler;
  TQualifier *argQualifier;
  TType *argType;
  TQualifier *formalQualifier;
  TIntermNode *arg;
  long *plStack_170;
  int i;
  TIntermAggregate *aggregate;
  TFunction *pTStack_160;
  bool builtIn;
  TFunction *fnCandidate;
  TString local_150;
  pool_allocator<char> local_128;
  TString local_120;
  TString local_f8;
  undefined1 local_d0 [8];
  TType type;
  TIntermTyped *result;
  TIntermNode *arguments_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  type.spirvType = (TSpirvType *)0x0;
  result = (TIntermTyped *)arguments;
  arguments_local = (TIntermNode *)function;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0) ||
      (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) == 0))
     || (type.spirvType = (TSpirvType *)vkRelaxedRemapFunctionCall(this,loc,function,arguments),
        this_local = (TParseContext *)type.spirvType,
        (TParseContext *)type.spirvType == (TParseContext *)0x0)) {
    iVar7 = (*arguments_local->_vptr_TIntermNode[0x1b])();
    if (iVar7 == 0x1ee) {
      type.spirvType =
           (TSpirvType *)
           handleLengthMethod(this,(TSourceLoc *)function_local,(TFunction *)arguments_local,
                              &result->super_TIntermNode);
    }
    else {
      iVar7 = (*arguments_local->_vptr_TIntermNode[0x1b])();
      if (iVar7 == 0) {
        aggregate._7_1_ = 0;
        pTStack_160 = findFunction(this,(TSourceLoc *)function_local,(TFunction *)arguments_local,
                                   (bool *)((long)&aggregate + 7));
        if (pTStack_160 != (TFunction *)0x0) {
          if (((aggregate._7_1_ & 1) != 0) &&
             ((iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0xf8 ||
              (iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0xf9)))) {
            pTVar3 = function_local;
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[3])();
            pcVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var,iVar7));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,pTVar3,1,&E_GL_EXT_shader_quad_control,pcVar12);
          }
          if (((aggregate._7_1_ & 1) != 0) &&
             (iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x11])(), pTVar3 = function_local
             , iVar7 != 0)) {
            uVar8 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x11])();
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x12])();
            iVar9 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[3])();
            pcVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_01,iVar9));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,pTVar3,(ulong)uVar8,CONCAT44(extraout_var_00,iVar7),pcVar12);
          }
          if ((aggregate._7_1_ & 1) != 0) {
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0xc])();
            bVar6 = TType::contains16BitFloat((TType *)CONCAT44(extraout_var_02,iVar7));
            if (bVar6) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                        (this,function_local,"built-in function",
                         "float16 types can only be in uniform block or buffer storage");
            }
          }
          if ((aggregate._7_1_ & 1) != 0) {
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0xc])();
            bVar6 = TType::contains16BitInt((TType *)CONCAT44(extraout_var_03,iVar7));
            if (bVar6) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                        (this,function_local,"built-in function",
                         "(u)int16 types can only be in uniform block or buffer storage");
            }
          }
          if ((aggregate._7_1_ & 1) != 0) {
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0xc])();
            bVar6 = TType::contains8BitInt((TType *)CONCAT44(extraout_var_04,iVar7));
            if (bVar6) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                        (this,function_local,"built-in function",
                         "(u)int8 types can only be in uniform block or buffer storage");
            }
          }
          if (((aggregate._7_1_ & 1) != 0) &&
             ((iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0x210 ||
              (iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0x207)))) {
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x28])(pTStack_160,0);
            this_00 = (TSampler *)
                      (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar7) + 8) + 0x48))();
            bVar6 = TSampler::isMultiSample(this_00);
            pTVar3 = function_local;
            if ((bVar6) && ((this->super_TParseContextBase).super_TParseVersions.version < 0x8d)) {
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[3])();
              pcVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_06,iVar7));
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                        (this,pTVar3,1,&E_GL_ARB_texture_multisample,pcVar12);
            }
          }
          if (result != (TIntermTyped *)0x0) {
            iVar7 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
            plStack_170 = (long *)CONCAT44(extraout_var_07,iVar7);
            for (arg._4_4_ = 0; uVar8 = arg._4_4_,
                iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x24])(), (int)uVar8 < iVar7;
                arg._4_4_ = arg._4_4_ + 1) {
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x24])();
              if (iVar7 == 1) {
                local_290 = result;
              }
              else {
                if (plStack_170 == (long *)0x0) {
                  local_298 = result;
                }
                else {
                  pvVar17 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                            (**(code **)(*plStack_170 + 400))();
                  ppTVar18 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                             operator[](pvVar17,(long)(int)arg._4_4_);
                  local_298 = (TIntermTyped *)*ppTVar18;
                }
                local_290 = local_298;
              }
              formalQualifier = (TQualifier *)local_290;
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x28])
                                (pTStack_160,(ulong)arg._4_4_);
              argType = (TType *)(**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar7) + 8) +
                                             0x50))();
              bVar6 = TQualifier::isParamOutput((TQualifier *)argType);
              if (bVar6) {
                iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                uVar13 = (**(code **)(formalQualifier->semanticName + 0x18))();
                uVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x42])(this,CONCAT44(extraout_var_09,iVar7),"assign",uVar13);
                if ((uVar8 & 1) != 0) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_10,iVar7),
                             "Non-L-value cannot be passed for \'out\' or \'inout\' parameters.",
                             "out","");
                }
              }
              bVar6 = TQualifier::isSpirvLiteral((TQualifier *)argType);
              if (bVar6) {
                plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
                this_01 = (TQualifier *)(**(code **)(*plVar14 + 0x108))();
                bVar6 = TQualifier::isFrontEndConstant(this_01);
                if (!bVar6) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_11,iVar7),
                             "Non front-end constant expressions cannot be passed for \'spirv_literal\' parameters."
                             ,"spirv_literal","");
                }
              }
              plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
              argQualifier = (TQualifier *)(**(code **)(*plVar14 + 0xf0))();
              pTStack_198 = (TQualifier *)(**(code **)(argQualifier->semanticName + 0x58))();
              bVar6 = TIntermediate::getBindlessMode
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
              local_2a1 = 0;
              if (bVar6) {
                local_2a1 = (**(code **)(argQualifier->semanticName + 0x1b8))();
              }
              message._7_1_ = local_2a1 & 1;
              bVar6 = TQualifier::isMemory(pTStack_198);
              if (((bVar6) && ((message._7_1_ & 1) == 0)) &&
                 ((uVar15 = (**(code **)(argQualifier->semanticName + 0x1b0))(), (uVar15 & 1) != 0
                  || (bVar6 = TType::isReference((TType *)argQualifier), bVar6)))) {
                local_1a8 = "argument cannot drop memory qualifier when passed to formal parameter";
                if (((*(ulong *)&pTStack_198->field_0x8 >> 0x32 & 1) != 0) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x32 & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_12,iVar7),local_1a8,"volatile","");
                }
                if ((((*(ulong *)&pTStack_198->field_0x8 >> 0x31 & 1) != 0) &&
                    ((*(ulong *)&argType->field_0x8 >> 0x34 & 1) == 0)) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x31 & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_13,iVar7),local_1a8,"coherent","");
                }
                if ((((*(ulong *)&pTStack_198->field_0x8 >> 0x34 & 1) != 0) &&
                    ((*(ulong *)&argType->field_0x8 >> 0x34 & 1) == 0)) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x31 & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_14,iVar7),local_1a8,"devicecoherent","");
                }
                if ((((*(ulong *)&pTStack_198->field_0x8 >> 0x35 & 1) != 0) &&
                    ((*(ulong *)&argType->field_0x8 >> 0x35 & 1) == 0)) &&
                   (((*(ulong *)&argType->field_0x8 >> 0x34 & 1) == 0 &&
                    ((*(ulong *)&argType->field_0x8 >> 0x31 & 1) == 0)))) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_15,iVar7),local_1a8,"queuefamilycoherent",""
                            );
                }
                if (((((*(ulong *)&pTStack_198->field_0x8 >> 0x36 & 1) != 0) &&
                     ((*(ulong *)&argType->field_0x8 >> 0x36 & 1) == 0)) &&
                    ((*(ulong *)&argType->field_0x8 >> 0x35 & 1) == 0)) &&
                   (((*(ulong *)&argType->field_0x8 >> 0x34 & 1) == 0 &&
                    ((*(ulong *)&argType->field_0x8 >> 0x31 & 1) == 0)))) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_16,iVar7),local_1a8,"workgroupcoherent","");
                }
                if ((((*(ulong *)&pTStack_198->field_0x8 >> 0x37 & 1) != 0) &&
                    ((*(ulong *)&argType->field_0x8 >> 0x37 & 1) == 0)) &&
                   (((*(ulong *)&argType->field_0x8 >> 0x36 & 1) == 0 &&
                    ((((*(ulong *)&argType->field_0x8 >> 0x35 & 1) == 0 &&
                      ((*(ulong *)&argType->field_0x8 >> 0x34 & 1) == 0)) &&
                     ((*(ulong *)&argType->field_0x8 >> 0x31 & 1) == 0)))))) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_17,iVar7),local_1a8,"subgroupcoherent","");
                }
                if (((*(ulong *)&pTStack_198->field_0x8 >> 0x2f & 1) != 0) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x2f & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_18,iVar7),local_1a8,"readonly","");
                }
                if (((*(ulong *)&pTStack_198->field_0x8 >> 0x30 & 1) != 0) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x30 & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_19,iVar7),local_1a8,"writeonly","");
                }
                if (((*(ulong *)&pTStack_198->field_0x8 >> 0x33 & 1) != 0) &&
                   ((*(ulong *)&argType->field_0x8 >> 0x33 & 1) == 0)) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_20,iVar7),local_1a8,"nontemporal","");
                }
              }
              if ((aggregate._7_1_ & 1) == 0) {
                TVar10 = TQualifier::getFormat(pTStack_198);
                TVar11 = TQualifier::getFormat((TQualifier *)argType);
                if ((TVar10 != TVar11) &&
                   ((bVar6 = TQualifier::isWriteOnly((TQualifier *)argType), !bVar6 ||
                    ((TVar10 = TQualifier::getFormat((TQualifier *)argType), TVar10 != ElfNone &&
                     (TVar10 = TQualifier::getFormat(pTStack_198), TVar10 != ElfNone)))))) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_21,iVar7),"image formats must match",
                             "format","");
                }
              }
              if ((aggregate._7_1_ & 1) != 0) {
                plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
                pTVar16 = (TType *)(**(code **)(*plVar14 + 0xf0))();
                bVar6 = TType::contains16BitFloat(pTVar16);
                if (bVar6) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                            (this,CONCAT44(extraout_var_22,iVar7),"built-in function",
                             "float16 types can only be in uniform block or buffer storage");
                }
              }
              if ((aggregate._7_1_ & 1) != 0) {
                plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
                pTVar16 = (TType *)(**(code **)(*plVar14 + 0xf0))();
                bVar6 = TType::contains16BitInt(pTVar16);
                if (bVar6) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                            (this,CONCAT44(extraout_var_23,iVar7),"built-in function",
                             "(u)int16 types can only be in uniform block or buffer storage");
                }
              }
              if ((aggregate._7_1_ & 1) != 0) {
                plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
                pTVar16 = (TType *)(**(code **)(*plVar14 + 0xf0))();
                bVar6 = TType::contains8BitInt(pTVar16);
                if (bVar6) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                            (this,CONCAT44(extraout_var_24,iVar7),"built-in function",
                             "(u)int8 types can only be in uniform block or buffer storage");
                }
              }
              if ((((aggregate._7_1_ & 1) != 0) &&
                  (iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0x15f))
                 && (arg._4_4_ == 1)) {
                plVar14 = (long *)(**(code **)(formalQualifier->semanticName + 0x18))();
                plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))();
                iVar7 = (**(code **)(*plVar14 + 0x38))();
                pvVar17 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          (**(code **)(*plStack_170 + 400))();
                ppTVar18 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                           operator[](pvVar17,0);
                iVar9 = (*(*ppTVar18)->_vptr_TIntermNode[3])();
                plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar9) + 0xf0))();
                iVar9 = (**(code **)(*plVar14 + 0x38))();
                if (iVar7 != iVar9) {
                  iVar7 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
                  iVar9 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[3])();
                  pcVar12 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)CONCAT44(extraout_var_27,iVar9));
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_26,iVar7),
                             "cooperative vector basic types must match",pcVar12,"");
                }
              }
            }
            addInputArgumentConversions(this,pTStack_160,(TIntermNode **)&result);
          }
          if (((aggregate._7_1_ & 1) == 0) ||
             (iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar7 == 0)) {
            iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x1b])();
            pTVar5 = result;
            if (iVar7 == 7) {
              call = (TIntermAggregate *)(function_local->super_TSymbol)._vptr_TSymbol;
              local_1d0 = (function_local->super_TSymbol).name;
              local_1c8 = (function_local->super_TSymbol).mangledName;
              type.spirvType =
                   (TSpirvType *)
                   handleBuiltInFunctionCall
                             (this,*(TSourceLoc *)&function_local->super_TSymbol,
                              &result->super_TIntermNode,pTStack_160);
            }
            else {
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0xc])();
              type.spirvType =
                   (TSpirvType *)
                   TIntermediate::setAggregateOperator
                             (pTVar1,&pTVar5->super_TIntermNode,EOpFunctionCall,
                              (TType *)CONCAT44(extraout_var_28,iVar7),(TSourceLoc *)function_local)
              ;
              iVar7 = (*(((TIntermTyped *)type.spirvType)->super_TIntermNode)._vptr_TIntermNode[6])
                                ();
              pTVar20 = (TIntermAggregate *)CONCAT44(extraout_var_29,iVar7);
              local_1e0 = pTVar20;
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[6])();
              (*(pTVar20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x34])(pTVar20,CONCAT44(extraout_var_30,iVar7));
              if ((aggregate._7_1_ & 1) == 0) {
                (*(local_1e0->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x36])();
                bVar6 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
                if (bVar6) {
                  TParseVersions::requireProfile
                            ((TParseVersions *)this,(TSourceLoc *)function_local,-9,
                             "calling user function from global scope");
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
                  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&qualifierList);
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  basic_string<glslang::std::allocator<char>>
                            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              *)&local_208,"main(",(pool_allocator<char> *)&qualifierList);
                  iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[6])();
                  TIntermediate::addToCallGraph
                            (pTVar1,pTVar2,&local_208,(TString *)CONCAT44(extraout_var_31,iVar7));
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  ~basic_string(&local_208);
                }
                else {
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
                  iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[6])();
                  TIntermediate::addToCallGraph
                            (pTVar1,pTVar2,&this->currentCaller,
                             (TString *)CONCAT44(extraout_var_32,iVar7));
                }
              }
              if ((aggregate._7_1_ & 1) == 0) {
                userFunctionCallCheck(this,(TSourceLoc *)function_local,local_1e0);
              }
              else {
                nonOpBuiltInCheck(this,(TSourceLoc *)function_local,pTStack_160,local_1e0);
              }
            }
          }
          else {
            local_1c0 = (function_local->super_TSymbol)._vptr_TSymbol;
            local_1b8 = (function_local->super_TSymbol).name;
            local_1b0 = (function_local->super_TSymbol).mangledName;
            type.spirvType =
                 (TSpirvType *)
                 handleBuiltInFunctionCall
                           (this,*(TSourceLoc *)&function_local->super_TSymbol,
                            &result->super_TIntermNode,pTStack_160);
          }
          lVar19 = (*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                             allocator)->inUseList)();
          if (lVar19 != 0) {
            plVar14 = (long *)(*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.
                                         super_allocator_type.allocator)->inUseList)();
            _qual = (vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                     *)(**(code **)(*plVar14 + 0x1c0))();
            for (unaryNode._4_4_ = 0; uVar8 = unaryNode._4_4_,
                iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x24])(), pTVar3 = pTStack_160,
                (int)uVar8 < iVar7; unaryNode._4_4_ = unaryNode._4_4_ + 1) {
              iVar7 = (*(pTStack_160->super_TSymbol)._vptr_TSymbol[0x28])
                                (pTStack_160,(ulong)unaryNode._4_4_);
              lVar19 = (**(code **)(**(long **)(CONCAT44(extraout_var_33,iVar7) + 8) + 0x50))();
              unaryNode._0_4_ = (uint)*(undefined8 *)(lVar19 + 8) & 0x7f;
              std::
              vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
              ::push_back(_qual,(value_type *)&unaryNode);
            }
            pTVar20 = (TIntermAggregate *)
                      (*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                                allocator)->inUseList)();
            type.spirvType = (TSpirvType *)addOutputArgumentConversions(this,pTVar3,pTVar20);
          }
          handleCoopMat2FunctionCall
                    (this,(TSourceLoc *)function_local,pTStack_160,(TIntermTyped *)type.spirvType,
                     &result->super_TIntermNode);
          plVar14 = (long *)(*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.
                                       super_allocator_type.allocator)->headerSkip)();
          pTVar16 = (TType *)(**(code **)(*plVar14 + 0xf0))();
          bVar6 = TType::isCoopVecNV(pTVar16);
          if (bVar6) {
            plVar14 = (long *)(*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.
                                         super_allocator_type.allocator)->headerSkip)();
            plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))();
            uVar15 = (**(code **)(*plVar14 + 0x188))();
            if ((uVar15 & 1) == 0) {
              plVar14 = (long *)(**(code **)&((((type.spirvType)->spirvInst).set._M_dataplus.
                                               super_allocator_type.allocator)->stack).
                                             super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                             ._M_impl.super__Vector_impl_data)();
              pTVar4 = type.spirvType;
              if (plVar14 == (long *)0x0) {
                plVar14 = (long *)(*(code *)(((type.spirvType)->spirvInst).set._M_dataplus.
                                             super_allocator_type.allocator)->inUseList)();
                pvVar17 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          (**(code **)(*plVar14 + 400))();
                ppTVar18 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                           operator[](pvVar17,0);
                iVar7 = (*(*ppTVar18)->_vptr_TIntermNode[3])();
                uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar7) + 0xf0))();
                (*(code *)(pTVar4->spirvInst).set._M_dataplus.super_allocator_type.allocator[2].
                          freeList)(pTVar4,uVar13);
              }
              else {
                plVar14 = (long *)(**(code **)(*plVar14 + 0x188))();
                plVar14 = (long *)(**(code **)(*plVar14 + 0x18))();
                uVar13 = (**(code **)(*plVar14 + 0xf0))();
                (*(code *)(pTVar4->spirvInst).set._M_dataplus.super_allocator_type.allocator[2].
                          freeList)(pTVar4,uVar13);
              }
            }
          }
        }
      }
      else {
        TType::TType((TType *)local_d0,EbtVoid,EvqTemporary,1,0,0,false);
        pTVar3 = function_local;
        function_00 = arguments_local;
        pTVar5 = result;
        op = (*arguments_local->_vptr_TIntermNode[0x1b])();
        bVar6 = constructorError(this,(TSourceLoc *)pTVar3,&pTVar5->super_TIntermNode,
                                 (TFunction *)function_00,op,(TType *)local_d0);
        if ((!bVar6) &&
           (type.spirvType =
                 (TSpirvType *)
                 addConstructor(this,(TSourceLoc *)function_local,&result->super_TIntermNode,
                                (TType *)local_d0), pTVar3 = function_local,
           (TIntermTyped *)type.spirvType == (TIntermTyped *)0x0)) {
          bVar6 = TIntermediate::getEnhancedMsgs
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          pool_allocator<char>::pool_allocator(&local_128);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_120,"",&local_128);
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&fnCandidate);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_150,"",(pool_allocator<char> *)&fnCandidate);
          TType::getCompleteString
                    (&local_f8,(TType *)local_d0,bVar6,true,true,true,&local_120,&local_150);
          pcVar12 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_f8);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar3,"cannot construct with these arguments",pcVar12,"");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_f8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_150);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_120);
        }
        TType::~TType((TType *)local_d0);
      }
    }
    if (type.spirvType == (TSpirvType *)0x0) {
      type.spirvType =
           (TSpirvType *)
           TIntermediate::addConstantUnion
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,EbtFloat
                      ,(TSourceLoc *)function_local,false);
    }
    this_local = (TParseContext *)type.spirvType;
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed) {
        // allow calls that are invalid in Vulkan Semantics to be invisibily
        // remapped to equivalent valid functions
        result = vkRelaxedRemapFunctionCall(loc, function, arguments);
        if (result)
            return result;
    }

    if (function->getBuiltInOp() == EOpArrayLength)
        result = handleLengthMethod(loc, function, arguments);
    else if (function->getBuiltInOp() != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, function->getBuiltInOp(), type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = addConstructor(loc, arguments, type);
            if (result == nullptr)
                error(loc, "cannot construct with these arguments", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str(), "");
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate;
        bool builtIn {false};
        fnCandidate = findFunction(loc, *function, builtIn);
        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // Error check for a function requiring specific extensions present.
            if (builtIn &&
                (fnCandidate->getBuiltInOp() == EOpSubgroupQuadAll || fnCandidate->getBuiltInOp() == EOpSubgroupQuadAny))
                requireExtensions(loc, 1, &E_GL_EXT_shader_quad_control, fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getNumExtensions())
                requireExtensions(loc, fnCandidate->getNumExtensions(), fnCandidate->getExtensions(), fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getType().contains16BitFloat())
                requireFloat16Arithmetic(loc, "built-in function", "float16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains16BitInt())
                requireInt16Arithmetic(loc, "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains8BitInt())
                requireInt8Arithmetic(loc, "built-in function", "(u)int8 types can only be in uniform block or buffer storage");
            if (builtIn && (fnCandidate->getBuiltInOp() == EOpTextureFetch || fnCandidate->getBuiltInOp() == EOpTextureQuerySize)) {
                if ((*fnCandidate)[0].type->getSampler().isMultiSample() && version <= 140)
                    requireExtensions(loc, 1, &E_GL_ARB_texture_multisample, fnCandidate->getName().c_str());
            }
            if (arguments != nullptr) {
                // Make sure qualifications work for these arguments.
                TIntermAggregate* aggregate = arguments->getAsAggregate();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
                    // is the single argument itself or its children are the arguments.  Only one argument
                    // means take 'arguments' itself as the one argument.
                    TIntermNode* arg = fnCandidate->getParamCount() == 1 ? arguments : (aggregate ? aggregate->getSequence()[i] : arguments);
                    TQualifier& formalQualifier = (*fnCandidate)[i].type->getQualifier();
                    if (formalQualifier.isParamOutput()) {
                        if (lValueErrorCheck(arguments->getLoc(), "assign", arg->getAsTyped()))
                            error(arguments->getLoc(), "Non-L-value cannot be passed for 'out' or 'inout' parameters.", "out", "");
                    }
                    if (formalQualifier.isSpirvLiteral()) {
                        if (!arg->getAsTyped()->getQualifier().isFrontEndConstant()) {
                            error(arguments->getLoc(),
                                  "Non front-end constant expressions cannot be passed for 'spirv_literal' parameters.",
                                  "spirv_literal", "");
                        }
                    }
                    const TType& argType = arg->getAsTyped()->getType();
                    const TQualifier& argQualifier = argType.getQualifier();
                    bool containsBindlessSampler = intermediate.getBindlessMode() && argType.containsSampler();
                    if (argQualifier.isMemory() && !containsBindlessSampler && (argType.containsOpaque() || argType.isReference())) {
                        const char* message = "argument cannot drop memory qualifier when passed to formal parameter";
                        if (argQualifier.volatil && ! formalQualifier.volatil)
                            error(arguments->getLoc(), message, "volatile", "");
                        if (argQualifier.coherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "coherent", "");
                        if (argQualifier.devicecoherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "devicecoherent", "");
                        if (argQualifier.queuefamilycoherent && ! (formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "queuefamilycoherent", "");
                        if (argQualifier.workgroupcoherent && ! (formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "workgroupcoherent", "");
                        if (argQualifier.subgroupcoherent && ! (formalQualifier.subgroupcoherent || formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "subgroupcoherent", "");
                        if (argQualifier.readonly && ! formalQualifier.readonly)
                            error(arguments->getLoc(), message, "readonly", "");
                        if (argQualifier.writeonly && ! formalQualifier.writeonly)
                            error(arguments->getLoc(), message, "writeonly", "");
                        if (argQualifier.nontemporal && ! formalQualifier.nontemporal)
                            error(arguments->getLoc(), message, "nontemporal", "");
                        // Don't check 'restrict', it is different than the rest:
                        // "...but only restrict can be taken away from a calling argument, by a formal parameter that
                        // lacks the restrict qualifier..."
                    }
                    if (!builtIn && argQualifier.getFormat() != formalQualifier.getFormat()) {
                        // we have mismatched formats, which should only be allowed if writeonly
                        // and at least one format is unknown
                        if (!formalQualifier.isWriteOnly() || (formalQualifier.getFormat() != ElfNone &&
                                                                  argQualifier.getFormat() != ElfNone))
                            error(arguments->getLoc(), "image formats must match", "format", "");
                    }
                    if (builtIn && arg->getAsTyped()->getType().contains16BitFloat())
                        requireFloat16Arithmetic(arguments->getLoc(), "built-in function", "float16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains16BitInt())
                        requireInt16Arithmetic(arguments->getLoc(), "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains8BitInt())
                        requireInt8Arithmetic(arguments->getLoc(), "built-in function", "(u)int8 types can only be in uniform block or buffer storage");

                    // Check that coopVecOuterProductAccumulateNV vector component types match
                    if (builtIn && fnCandidate->getBuiltInOp() == EOpCooperativeVectorOuterProductAccumulateNV &&
                        i == 1 && arg->getAsTyped()->getType().getBasicType() != aggregate->getSequence()[0]->getAsTyped()->getType().getBasicType())
                        error(arguments->getLoc(), "cooperative vector basic types must match", fnCandidate->getName().c_str(), "");

                    // TODO 4.5 functionality:  A shader will fail to compile
                    // if the value passed to the memargument of an atomic memory function does not correspond to a buffer or
                    // shared variable. It is acceptable to pass an element of an array or a single component of a vector to the
                    // memargument of an atomic memory function, as long as the underlying array or vector is a buffer or
                    // shared variable.
                }

                // Convert 'in' arguments
                addInputArgumentConversions(*fnCandidate, arguments);  // arguments may be modified if it's just a single argument node
            }

            if (builtIn && fnCandidate->getBuiltInOp() != EOpNull) {
                // A function call mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else if (fnCandidate->getBuiltInOp() == EOpSpirvInst) {
                // When SPIR-V instruction qualifier is specified, the function call is still mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(fnCandidate->getMangledName());

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    if (symbolTable.atGlobalLevel()) {
                        requireProfile(loc, ~EEsProfile, "calling user function from global scope");
                        intermediate.addToCallGraph(infoSink, "main(", fnCandidate->getMangledName());
                    } else
                        intermediate.addToCallGraph(infoSink, currentCaller, fnCandidate->getMangledName());
                }

                if (builtIn)
                    nonOpBuiltInCheck(loc, *fnCandidate, *call);
                else
                    userFunctionCallCheck(loc, *call);
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            if (result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    qualifierList.push_back(qual);
                }
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsAggregate());
            }

            handleCoopMat2FunctionCall(loc, fnCandidate, result, arguments);

            if (result->getAsTyped()->getType().isCoopVecNV() &&
               !result->getAsTyped()->getType().isParameterized()) {
                if (auto unaryNode = result->getAsUnaryNode())
                    result->setType(unaryNode->getOperand()->getAsTyped()->getType());
                else
                    result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
            }
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}